

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_promise_executor(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic,
                           JSValue *func_data)

{
  int iVar1;
  JSValueUnion *pJVar2;
  JSContext *in_RDI;
  long in_R8;
  JSValue JVar3;
  long in_stack_00000008;
  int i;
  JSValueUnion local_50;
  JSValueUnion local_48;
  int local_40;
  JSValueUnion local_10;
  int64_t local_8;
  
  local_40 = 0;
  while( true ) {
    if (1 < local_40) {
      local_10.ptr = (void *)(local_10 << 0x20);
      local_8 = 3;
      return _local_10;
    }
    iVar1 = JS_IsUndefined(*(JSValue *)(in_stack_00000008 + (long)local_40 * 0x10));
    if (iVar1 == 0) break;
    pJVar2 = (JSValueUnion *)(in_stack_00000008 + (long)local_40 * 0x10);
    JVar3 = JS_DupValue(in_RDI,*(JSValue *)(in_R8 + (long)local_40 * 0x10));
    local_50 = JVar3.u;
    *pJVar2 = local_50;
    local_48 = (JSValueUnion)JVar3.tag;
    pJVar2[1] = local_48;
    local_40 = local_40 + 1;
  }
  JVar3 = JS_ThrowTypeError(in_RDI,"resolving function already set");
  return JVar3;
}

Assistant:

static JSValue js_promise_executor(JSContext *ctx,
                                   JSValueConst this_val,
                                   int argc, JSValueConst *argv,
                                   int magic, JSValue *func_data)
{
    int i;

    for(i = 0; i < 2; i++) {
        if (!JS_IsUndefined(func_data[i]))
            return JS_ThrowTypeError(ctx, "resolving function already set");
        func_data[i] = JS_DupValue(ctx, argv[i]);
    }
    return JS_UNDEFINED;
}